

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gems.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  pointer __p;
  ostream *poVar3;
  pointer __p_00;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  __uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_> local_58;
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  bling;
  
  if (argc < 2) {
    uVar2 = 10;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bling,argv[1],(allocator<char> *)&local_58);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &bling,"-h");
    std::__cxx11::string::~string((string *)&bling);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Usage:");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
      poVar3 = std::operator<<(poVar3,*argv);
      poVar3 = std::operator<<(poVar3," [N]");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Options:");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&std::cerr,"\tN\t\tNumber of diamonds [default: 10]");
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      return 0;
    }
    uVar2 = atoi(argv[1]);
  }
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::vector(&bling,(long)(int)uVar2,(allocator_type *)&local_58);
  lVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 * 8 != lVar6; lVar6 = lVar6 + 8) {
    __p_00 = (pointer)operator_new(4);
    __p_00->lifespan = FOREVER;
    local_58._M_t.super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
    super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl =
         (tuple<gems::Diamond_*,_std::default_delete<gems::Diamond>_>)
         (_Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>)0x0;
    std::__uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>::reset
              ((__uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_> *)
               ((long)&((bling.
                         super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
                       super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl + lVar6),__p_00);
    std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>::~unique_ptr
              ((unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *)&local_58);
  }
  uVar4 = 0;
  for (; bling.
         super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         bling.
         super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      bling.
      super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           bling.
           super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    uVar4 = uVar4 + ((((bling.
                        super__Vector_base<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<gems::Diamond,_std::default_delete<gems::Diamond>_>._M_t
                      .super__Tuple_impl<0UL,_gems::Diamond_*,_std::default_delete<gems::Diamond>_>.
                      super__Head_base<0UL,_gems::Diamond_*,_false>._M_head_impl)->lifespan ==
                    FOREVER);
  }
  if (uVar4 == uVar2) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
    pcVar5 = " diamonds are forever";
  }
  else {
    pcVar5 = "Looks ike cubic zirconium to me";
    poVar3 = (ostream *)&std::cout;
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::~vector(&bling);
  return 0;
}

Assistant:

int main(int argc, char **argv)
    {
        int n = 10;
        if(argc > 1) {
            if(std::string(argv[1]) == "-h") {
                std::cerr << "Usage:" << std::endl;
                std::cerr << "\t" << argv[0] << " [N]" << std::endl;
                std::cerr << std::endl;
                std::cerr << "Options:" << std::endl;
                std::cerr << "\tN\t\tNumber of diamonds [default: 10]";
                std::cerr << std::endl;
                return 0;
            }
            n = std::atoi(argv[1]);
        }

        std::vector<std::unique_ptr<Diamond>> bling(n);
        for(int i = 0; i < n; i++) {
            bling[i] = std::unique_ptr<Diamond>(new Diamond());
        }

        int is_forever = 0;
        for(auto &d : bling) {
            is_forever += int(d->get_lifespan() == FOREVER);
        }

        if(is_forever == n) {
            std::cout << n << " diamonds are forever" << std::endl;
        }
        else {
            std::cout << "Looks ike cubic zirconium to me" << std::endl;
        }

        return 0;
    }